

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O1

void libaom_examples::anon_unknown_0::TestConversion(double v)

{
  internal iVar1;
  SEARCH_METHODS *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  DepthRepresentationElement e;
  char *in_stack_ffffffffffffff98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa0;
  internal iVar2;
  undefined7 in_stack_ffffffffffffffa9;
  undefined8 *val1;
  undefined8 *puVar3;
  AssertHelper in_stack_ffffffffffffffb8;
  string local_38;
  DepthRepresentationElement local_18;
  
  iVar1 = (internal)double_to_depth_representation_element(v,&local_18);
  val1 = (undefined8 *)0x0;
  iVar2 = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffa0);
    std::ostream::_M_insert<double>(v);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&stack0xffffffffffffffa8,
               (AssertionResult *)"double_to_depth_representation_element(v, &e)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
               ,0xd3,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&stack0xffffffffffffffa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    puVar3 = val1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
      puVar3 = val1;
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffffa0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa0._M_head_impl + 8))();
    }
    val1 = puVar3;
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    if (!(bool)iVar1) {
      return;
    }
  }
  depth_representation_element_to_double(&local_18);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff98,(char *)0x848645,(char *)in_stack_ffffffffffffffb8.data_,
             (double)val1,(double)CONCAT71(in_stack_ffffffffffffffa9,iVar2),
             (double)in_stack_ffffffffffffffa0._M_head_impl);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
               ,0xd4,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa0,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa0);
    if ((long *)CONCAT71(in_stack_ffffffffffffffa9,iVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(in_stack_ffffffffffffffa9,iVar2) + 8))();
    }
  }
  if ((undefined8 *)local_38._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_38._M_string_length !=
        (undefined8 *)(local_38._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_38._M_string_length);
    }
    operator_delete((void *)local_38._M_string_length);
  }
  return;
}

Assistant:

void TestConversion(double v) {
  DepthRepresentationElement e;
  ASSERT_TRUE(double_to_depth_representation_element(v, &e)) << v;
  EXPECT_NEAR(depth_representation_element_to_double(e), v, 0.000000001);
}